

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessAnnounce
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  Value *pVVar2;
  char *begin;
  char *pcVar3;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  uint8_t count;
  uint16_t period;
  uint32_t channelMask;
  CommissionerAppPtr commissioner;
  Value local_1b0;
  string local_168;
  Error local_148;
  undefined1 local_120 [40];
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  format_string_checker<char> local_58;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x81) {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ = "too few arguments"
    ;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "too few arguments";
    local_58.context_.types_ = local_58.types_;
    while (begin = pcVar3, begin != "") {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_58);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_168,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_80._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_168);
    Value::Value(&local_1b0,(Error *)local_80);
    Value::operator=(__return_storage_ptr__,&local_1b0);
    Value::~Value(&local_1b0);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    this_00 = &local_168;
  }
  else {
    JobManager::GetSelectedCommissioner
              ((Error *)local_a8,
               (this->mJobManager).
               super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &commissioner);
    Value::Value(&local_1b0,(Error *)local_a8);
    pVVar2 = Value::operator=(__return_storage_ptr__,&local_1b0);
    EVar1 = (pVVar2->mError).mCode;
    Value::~Value(&local_1b0);
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    if (EVar1 != kNone) goto LAB_00194ea4;
    utils::ParseInteger<unsigned_int>
              ((Error *)local_d0,&channelMask,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    Value::Value(&local_1b0,(Error *)local_d0);
    pVVar2 = Value::operator=(__return_storage_ptr__,&local_1b0);
    EVar1 = (pVVar2->mError).mCode;
    Value::~Value(&local_1b0);
    std::__cxx11::string::~string((string *)(local_d0 + 8));
    if (EVar1 != kNone) goto LAB_00194ea4;
    utils::ParseInteger<unsigned_char>
              ((Error *)local_f8,&count,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2);
    Value::Value(&local_1b0,(Error *)local_f8);
    pVVar2 = Value::operator=(__return_storage_ptr__,&local_1b0);
    EVar1 = (pVVar2->mError).mCode;
    Value::~Value(&local_1b0);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
    if (EVar1 != kNone) goto LAB_00194ea4;
    utils::ParseInteger<unsigned_short>
              ((Error *)local_120,&period,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3);
    Value::Value(&local_1b0,(Error *)local_120);
    pVVar2 = Value::operator=(__return_storage_ptr__,&local_1b0);
    EVar1 = (pVVar2->mError).mCode;
    Value::~Value(&local_1b0);
    std::__cxx11::string::~string((string *)(local_120 + 8));
    if (EVar1 != kNone) goto LAB_00194ea4;
    (*((commissioner.
        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_CommissionerHandler)._vptr_CommissionerHandler[0x45])
              (&local_148,
               commissioner.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(ulong)channelMask,(ulong)count,(ulong)period,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 4);
    Value::Value(&local_1b0,&local_148);
    Value::operator=(__return_storage_ptr__,&local_1b0);
    Value::~Value(&local_1b0);
    this_00 = &local_148.mMessage;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00194ea4:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&commissioner.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessAnnounce(const Expression &aExpr)
{
    uint32_t           channelMask;
    uint8_t            count;
    uint16_t           period;
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    SuccessOrExit(value = ParseInteger(channelMask, aExpr[1]));
    SuccessOrExit(value = ParseInteger(count, aExpr[2]));
    SuccessOrExit(value = ParseInteger(period, aExpr[3]));
    SuccessOrExit(value =
                      commissioner->AnnounceBegin(channelMask, count, CommissionerApp::MilliSeconds(period), aExpr[4]));
exit:
    return value;
}